

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::set_all
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *c)

{
  uint local_1c;
  uint i;
  color_quad<unsigned_char,_int> *c_local;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  for (local_1c = 0; local_1c < this->m_total; local_1c = local_1c + 1) {
    color_quad<unsigned_char,_int>::operator=(this->m_pPixels + local_1c,c);
  }
  return;
}

Assistant:

void set_all(const color_type& c)
        {
            for (uint i = 0; i < m_total; i++)
            {
                m_pPixels[i] = c;
            }
        }